

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintSExpression::maybePrintUnreachableReplacement
          (PrintSExpression *this,Expression *curr,Type type)

{
  Index IVar1;
  Expression **ppEVar2;
  Expression *pEVar3;
  Iterator IVar4;
  undefined1 local_a0 [8];
  Unreachable unreachable;
  _Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> local_78;
  undefined1 local_60 [8];
  Drop drop;
  Iterator local_40;
  
  if (type.id == 1) {
    std::operator<<(this->o,"(block");
    if (this->minify == false) {
      std::operator<<(this->o," ;; (replaces something unreachable we can\'t emit)");
    }
    incIndent(this);
    AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
              ((AbstractChildIterator<wasm::ChildIterator> *)local_a0,curr);
    local_40.index = 0;
    local_40.parent = (Self *)local_a0;
    IVar4 = AbstractChildIterator<wasm::ChildIterator>::end
                      ((AbstractChildIterator<wasm::ChildIterator> *)local_a0);
    drop.value = (Expression *)IVar4.parent;
    IVar1 = 0;
    pEVar3 = (Expression *)local_a0;
    while ((IVar1 != IVar4.index || (pEVar3 != drop.value))) {
      ppEVar2 = AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*(&local_40);
      drop.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
           (uintptr_t)*ppEVar2;
      local_60._0_4_ = DropId;
      drop.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._id = InvalidId;
      drop.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._4_4_ = 0;
      printFullLine(this,(Expression *)local_60);
      IVar1 = local_40.index + 1;
      pEVar3 = (Expression *)local_40.parent;
      local_40.index = IVar1;
    }
    std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::~_Vector_base
              (&local_78);
    local_a0._0_4_ = UnreachableId;
    unreachable.super_SpecificExpression<(wasm::Expression::Id)23>.super_Expression._id = BlockId;
    unreachable.super_SpecificExpression<(wasm::Expression::Id)23>.super_Expression._4_4_ = 0;
    printFullLine(this,(Expression *)local_a0);
    decIndent(this);
    return;
  }
  visitExpression(this,curr);
  return;
}

Assistant:

void maybePrintUnreachableReplacement(Expression* curr, Type type) {
    // See the parallel function
    // PrintExpressionContents::printUnreachableReplacement for background. That
    // one handles the header, and this one the body. For convenience, this one
    // also gets a parameter of the type to check for unreachability, to avoid
    // boilerplate in the callers; if the type is not unreachable, it does the
    // normal behavior.
    //
    // Note that the list of instructions using that function must match those
    // using this one, so we print the header and body properly together.

    if (type != Type::unreachable) {
      visitExpression(curr);
      return;
    }

    // Emit a block with drops of the children.
    o << "(block";
    if (!minify) {
      o << " ;; (replaces something unreachable we can't emit)";
    }
    incIndent();
    for (auto* child : ChildIterator(curr)) {
      Drop drop;
      drop.value = child;
      printFullLine(&drop);
    }
    Unreachable unreachable;
    printFullLine(&unreachable);
    decIndent();
  }